

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.cc
# Opt level: O0

void prometheus::detail::MetricsHandler::CleanupStalePointers
               (vector<std::weak_ptr<prometheus::Collectable>,_std::allocator<std::weak_ptr<prometheus::Collectable>_>_>
                *collectables)

{
  __normal_iterator<std::weak_ptr<prometheus::Collectable>_*,_std::vector<std::weak_ptr<prometheus::Collectable>,_std::allocator<std::weak_ptr<prometheus::Collectable>_>_>_>
  local_48;
  const_iterator local_40;
  weak_ptr<prometheus::Collectable> *local_30;
  weak_ptr<prometheus::Collectable> *local_28;
  __normal_iterator<std::weak_ptr<prometheus::Collectable>_*,_std::vector<std::weak_ptr<prometheus::Collectable>,_std::allocator<std::weak_ptr<prometheus::Collectable>_>_>_>
  local_20;
  const_iterator local_18;
  vector<std::weak_ptr<prometheus::Collectable>,_std::allocator<std::weak_ptr<prometheus::Collectable>_>_>
  *local_10;
  vector<std::weak_ptr<prometheus::Collectable>,_std::allocator<std::weak_ptr<prometheus::Collectable>_>_>
  *collectables_local;
  
  local_10 = collectables;
  local_28 = (weak_ptr<prometheus::Collectable> *)
             std::
             begin<std::vector<std::weak_ptr<prometheus::Collectable>,std::allocator<std::weak_ptr<prometheus::Collectable>>>>
                       (collectables);
  local_30 = (weak_ptr<prometheus::Collectable> *)
             std::
             end<std::vector<std::weak_ptr<prometheus::Collectable>,std::allocator<std::weak_ptr<prometheus::Collectable>>>>
                       (local_10);
  local_20 = std::
             remove_if<__gnu_cxx::__normal_iterator<std::weak_ptr<prometheus::Collectable>*,std::vector<std::weak_ptr<prometheus::Collectable>,std::allocator<std::weak_ptr<prometheus::Collectable>>>>,prometheus::detail::MetricsHandler::CleanupStalePointers(std::vector<std::weak_ptr<prometheus::Collectable>,std::allocator<std::weak_ptr<prometheus::Collectable>>>&)::__0>
                       (local_28,local_30);
  __gnu_cxx::
  __normal_iterator<std::weak_ptr<prometheus::Collectable>const*,std::vector<std::weak_ptr<prometheus::Collectable>,std::allocator<std::weak_ptr<prometheus::Collectable>>>>
  ::__normal_iterator<std::weak_ptr<prometheus::Collectable>*>
            ((__normal_iterator<std::weak_ptr<prometheus::Collectable>const*,std::vector<std::weak_ptr<prometheus::Collectable>,std::allocator<std::weak_ptr<prometheus::Collectable>>>>
              *)&local_18,&local_20);
  local_48._M_current =
       (weak_ptr<prometheus::Collectable> *)
       std::
       end<std::vector<std::weak_ptr<prometheus::Collectable>,std::allocator<std::weak_ptr<prometheus::Collectable>>>>
                 (local_10);
  __gnu_cxx::
  __normal_iterator<std::weak_ptr<prometheus::Collectable>const*,std::vector<std::weak_ptr<prometheus::Collectable>,std::allocator<std::weak_ptr<prometheus::Collectable>>>>
  ::__normal_iterator<std::weak_ptr<prometheus::Collectable>*>
            ((__normal_iterator<std::weak_ptr<prometheus::Collectable>const*,std::vector<std::weak_ptr<prometheus::Collectable>,std::allocator<std::weak_ptr<prometheus::Collectable>>>>
              *)&local_40,&local_48);
  std::
  vector<std::weak_ptr<prometheus::Collectable>,_std::allocator<std::weak_ptr<prometheus::Collectable>_>_>
  ::erase(collectables,local_18,local_40);
  return;
}

Assistant:

void MetricsHandler::CleanupStalePointers(
    std::vector<std::weak_ptr<Collectable>>& collectables) {
  collectables.erase(
      std::remove_if(std::begin(collectables), std::end(collectables),
                     [](const std::weak_ptr<Collectable>& candidate) {
                       return candidate.expired();
                     }),
      std::end(collectables));
}